

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O2

void __thiscall
xmrig::WorkerJob<3UL>::save(WorkerJob<3UL> *this,Job *job,uint32_t reserveCount,Backend backend)

{
  byte bVar1;
  size_t __n;
  uint32_t uVar2;
  ulong uVar3;
  undefined4 in_register_00000014;
  WorkerJob<3UL> *pWVar4;
  size_t i;
  long lVar5;
  
  bVar1 = job->m_index;
  this->m_index = bVar1;
  __n = job->m_size;
  Job::copy(this->m_jobs + bVar1,(EVP_PKEY_CTX *)job,
            (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,reserveCount));
  uVar3 = (ulong)this->m_index;
  this->m_rounds[uVar3] = 0;
  this->m_jobs[uVar3].m_backend = backend;
  pWVar4 = this;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    memcpy(pWVar4->m_blobs + uVar3,job->m_blob,__n);
    bVar1 = this->m_index;
    uVar2 = Nonce::next(bVar1,*(uint32_t *)
                               (this->m_blobs[bVar1] + this->m_jobs[bVar1].m_size * lVar5 + 0x27),
                        reserveCount);
    uVar3 = (ulong)this->m_index;
    *(uint32_t *)(this->m_blobs[uVar3] + this->m_jobs[uVar3].m_size * lVar5 + 0x27) = uVar2;
    pWVar4 = (WorkerJob<3UL> *)(pWVar4->m_blobs[0] + __n);
  }
  return;
}

Assistant:

inline void save(const Job &job, uint32_t reserveCount, Nonce::Backend backend)
    {
        m_index           = job.index();
        const size_t size = job.size();
        m_jobs[index()]   = job;
        m_rounds[index()] = 0;

        m_jobs[index()].setBackend(backend);

        for (size_t i = 0; i < N; ++i) {
            memcpy(m_blobs[index()] + (i * size), job.blob(), size);
            *nonce(i) = Nonce::next(index(), *nonce(i), reserveCount);
        }
    }